

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlCharEncInFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  int in_R9D;
  int iVar4;
  int written;
  int toconv;
  char buf [50];
  int local_70;
  uint local_6c;
  char local_68 [49];
  undefined1 local_37;
  
  iVar2 = -1;
  if (in != (xmlBufferPtr)0x0 &&
      (out != (xmlBufferPtr)0x0 && handler != (xmlCharEncodingHandler *)0x0)) {
    local_6c = in->use;
    if (local_6c == 0) {
      iVar2 = 0;
    }
    else {
      local_70 = ~out->use + out->size;
      if (local_70 <= (int)(local_6c * 2)) {
        xmlBufferGrow(out,out->size + local_6c * 2);
        local_70 = ~out->use + out->size;
      }
      iVar2 = xmlEncInputChunk(handler,out->content + out->use,&local_70,in->content,
                               (int *)&local_6c,in_R9D);
      xmlBufferShrink(in,local_6c);
      uVar3 = out->use + local_70;
      out->use = uVar3;
      out->content[uVar3] = '\0';
      iVar4 = -3;
      if (iVar2 != -1) {
        iVar4 = iVar2;
      }
      if (iVar4 == -2) {
        pbVar1 = in->content;
        snprintf(local_68,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*pbVar1,(ulong)pbVar1[1],
                 (ulong)pbVar1[2],(uint)pbVar1[3]);
        local_37 = 0;
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,(void *)0x0,0x1b,0x1773,XML_ERR_FATAL,(char *)0x0,0,local_68,(char *)0x0,
                        (char *)0x0,0,0,"input conversion failed due to input error, bytes %s\n",
                        local_68);
      }
      iVar2 = 0;
      if (iVar4 != -3) {
        iVar2 = iVar4;
      }
      if (local_70 != 0) {
        iVar2 = local_70;
      }
    }
  }
  return iVar2;
}

Assistant:

int
xmlCharEncInFunc(xmlCharEncodingHandler * handler, xmlBufferPtr out,
                 xmlBufferPtr in)
{
    int ret;
    int written;
    int toconv;

    if (handler == NULL)
        return (-1);
    if (out == NULL)
        return (-1);
    if (in == NULL)
        return (-1);

    toconv = in->use;
    if (toconv == 0)
        return (0);
    written = out->size - out->use -1; /* count '\0' */
    if (toconv * 2 >= written) {
        xmlBufferGrow(out, out->size + toconv * 2);
        written = out->size - out->use - 1;
    }
    ret = xmlEncInputChunk(handler, &out->content[out->use], &written,
                           in->content, &toconv, 1);
    xmlBufferShrink(in, toconv);
    out->use += written;
    out->content[out->use] = 0;
    if (ret == -1)
        ret = -3;

    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                            "converted %d bytes to %d bytes of input\n",
                            toconv, written);
#endif
            break;
        case -1:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                         "converted %d bytes to %d bytes of input, %d left\n",
                            toconv, written, in->use);
#endif
            break;
        case -3:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                        "converted %d bytes to %d bytes of input, %d left\n",
                            toconv, written, in->use);
#endif
            break;
        case -2: {
            char buf[50];

	    snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
		     in->content[0], in->content[1],
		     in->content[2], in->content[3]);
	    buf[49] = 0;
	    xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "input conversion failed due to input error, bytes %s\n",
		           buf);
        }
    }
    /*
     * Ignore when input buffer is not on a boundary
     */
    if (ret == -3)
        ret = 0;
    return (written? written : ret);
}